

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

csptr __thiscall pstack::Reader::view(Reader *this,string *name,Off offset,Off size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  csptr cVar2;
  Off local_68;
  Off offset_local;
  Off size_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_31;
  
  local_68 = size;
  std::__shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<pstack::Reader,void>
            (local_48,(__weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)
                      &name->_M_string_length);
  size_local = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstack::OffsetReader,std::allocator<pstack::OffsetReader>,std::__cxx11::string_const&,std::shared_ptr<pstack::Reader_const>,unsigned_long&,unsigned_long&>
            (&local_50,(OffsetReader **)&size_local,(allocator<pstack::OffsetReader> *)&local_31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset,
             (shared_ptr<const_pstack::Reader> *)local_48,&local_68,&offset_local);
  std::__shared_ptr<pstack::OffsetReader,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pstack::OffsetReader,pstack::OffsetReader>
            ((__shared_ptr<pstack::OffsetReader,(__gnu_cxx::_Lock_policy)2> *)&size_local,
             (OffsetReader *)size_local);
  _Var1._M_pi = local_50._M_pi;
  this->_vptr_Reader = (_func_int **)size_local;
  (this->super_enable_shared_from_this<pstack::Reader>)._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<pstack::Reader>)._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  size_local = 0;
  _Var1._M_pi = extraout_RDX;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    _Var1._M_pi = extraout_RDX_00;
  }
  cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (csptr)cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
Reader::view(const std::string &name, Off offset, Off size) const {
   return std::make_shared<OffsetReader>(name, shared_from_this(), offset, size);
}